

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImFont::AddRemapChar(ImFont *this,ImWchar dst,ImWchar src,bool overwrite_dst)

{
  int iVar1;
  int iVar2;
  unsigned_short *puVar3;
  char *__function;
  float fVar4;
  
  iVar1 = (this->IndexLookup).Size;
  if (iVar1 < 1) {
    __assert_fail("IndexLookup.Size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui_draw.cpp"
                  ,0x6e7,"void ImFont::AddRemapChar(ImWchar, ImWchar, bool)");
  }
  if (((int)(uint)dst < iVar1) && ((this->IndexLookup).Data[dst] == 0xffff && !overwrite_dst)) {
    return;
  }
  if (iVar1 <= (int)(uint)src && iVar1 <= (int)(uint)dst) {
    return;
  }
  GrowIndex(this,dst + 1);
  iVar2 = (this->IndexLookup).Size;
  if ((int)(uint)src < iVar1) {
    if (iVar2 <= (int)(uint)dst) {
LAB_00146f8f:
      __function = "value_type &ImVector<unsigned short>::operator[](int) [T = unsigned short]";
      goto LAB_00146fbb;
    }
    puVar3 = (this->IndexLookup).Data;
    puVar3[dst] = puVar3[src];
    fVar4 = (this->IndexXAdvance).Data[src];
  }
  else {
    if (iVar2 <= (int)(uint)dst) goto LAB_00146f8f;
    (this->IndexLookup).Data[dst] = 0xffff;
    fVar4 = 1.0;
  }
  if ((int)(uint)dst < (this->IndexXAdvance).Size) {
    (this->IndexXAdvance).Data[dst] = fVar4;
    return;
  }
  __function = "value_type &ImVector<float>::operator[](int) [T = float]";
LAB_00146fbb:
  __assert_fail("i < Size",
                "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.h"
                ,0x35b,__function);
}

Assistant:

void ImFont::AddRemapChar(ImWchar dst, ImWchar src, bool overwrite_dst)
{
    IM_ASSERT(IndexLookup.Size > 0);    // Currently this can only be called AFTER the font has been built, aka after calling ImFontAtlas::GetTexDataAs*() function.
    int index_size = IndexLookup.Size;

    if (dst < index_size && IndexLookup.Data[dst] == (unsigned short)-1 && !overwrite_dst) // 'dst' already exists
        return;
    if (src >= index_size && dst >= index_size) // both 'dst' and 'src' don't exist -> no-op
        return;

    GrowIndex(dst + 1);
    IndexLookup[dst] = (src < index_size) ? IndexLookup.Data[src] : (unsigned short)-1;
    IndexXAdvance[dst] = (src < index_size) ? IndexXAdvance.Data[src] : 1.0f;
}